

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

string * __thiscall
pybind11::detail::error_fetch_and_normalize::error_string_abi_cxx11_
          (error_fetch_and_normalize *this)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long local_40;
  long lStack_38;
  string local_30;
  
  if (this->m_lazy_error_string_completed == false) {
    format_value_and_trace_abi_cxx11_(&local_30,this);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x16efeb);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_40 = *plVar2;
      lStack_38 = plVar1[3];
      plVar3 = &local_40;
    }
    else {
      local_40 = *plVar2;
      plVar3 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&this->m_lazy_error_string,(ulong)plVar3);
    if (plVar3 != &local_40) {
      operator_delete(plVar3,local_40 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    this->m_lazy_error_string_completed = true;
  }
  return &this->m_lazy_error_string;
}

Assistant:

std::string const &error_string() const {
        if (!m_lazy_error_string_completed) {
            m_lazy_error_string += ": " + format_value_and_trace();
            m_lazy_error_string_completed = true;
        }
        return m_lazy_error_string;
    }